

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleUVFilterCols64_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x32,int dx)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)x32;
  lVar1 = 0;
  while( true ) {
    lVar2 = (long)uVar4 >> 0x10;
    if (dst_width + -1 <= (int)lVar1) break;
    uVar3 = (uint)(uVar4 >> 9) & 0x7f;
    *(ushort *)(dst_uv + lVar1 * 2) =
         (ushort)((*(ushort *)(src_uv + lVar2 * 2 + 2) & 0xff) * uVar3 +
                  (*(ushort *)(src_uv + lVar2 * 2) & 0xff) * (uVar3 ^ 0x7f) >> 7) |
         ((*(ushort *)(src_uv + lVar2 * 2 + 2) >> 8) * (short)uVar3 +
         (*(ushort *)(src_uv + lVar2 * 2) >> 8) * (short)(uVar3 ^ 0x7f)) * 2 & 0xff00;
    lVar2 = uVar4 + (long)dx;
    lVar5 = lVar2 >> 0x10;
    uVar3 = dx + (uint)uVar4 >> 9 & 0x7f;
    *(ushort *)(dst_uv + lVar1 * 2 + 2) =
         (ushort)((*(ushort *)(src_uv + lVar5 * 2 + 2) & 0xff) * uVar3 +
                  (*(ushort *)(src_uv + lVar5 * 2) & 0xff) * (uVar3 ^ 0x7f) >> 7) |
         ((*(ushort *)(src_uv + lVar5 * 2 + 2) >> 8) * (short)uVar3 +
         (*(ushort *)(src_uv + lVar5 * 2) >> 8) * (short)(uVar3 ^ 0x7f)) * 2 & 0xff00;
    uVar4 = lVar2 + dx;
    lVar1 = lVar1 + 2;
  }
  if ((dst_width & 1U) != 0) {
    uVar3 = (uint)uVar4 >> 9 & 0x7f;
    *(ushort *)(dst_uv + lVar1 * 2) =
         (ushort)((*(ushort *)(src_uv + lVar2 * 2 + 2) & 0xff) * uVar3 +
                  (*(ushort *)(src_uv + lVar2 * 2) & 0xff) * (uVar3 ^ 0x7f) >> 7) |
         ((*(ushort *)(src_uv + lVar2 * 2 + 2) >> 8) * (short)uVar3 +
         (*(ushort *)(src_uv + lVar2 * 2) >> 8) * (short)(uVar3 ^ 0x7f)) * 2 & 0xff00;
  }
  return;
}

Assistant:

void ScaleUVFilterCols64_C(uint8_t* dst_uv,
                           const uint8_t* src_uv,
                           int dst_width,
                           int x32,
                           int dx) {
  int64_t x = (int64_t)(x32);
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}